

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

void Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::CopyResourceLayout
               (PipelineResourceLayoutDesc *SrcLayout,PipelineResourceLayoutDesc *DstLayout,
               FixedLinearAllocator *MemPool)

{
  float fVar1;
  SHADER_VARIABLE_FLAGS SVar2;
  undefined *puVar3;
  ShaderResourceVariableDesc *pSVar4;
  ShaderResourceVariableDesc *pSVar5;
  ShaderResourceVariableDesc *pSVar6;
  Char *pCVar7;
  ImmutableSamplerDesc *pIVar8;
  ImmutableSamplerDesc *__src;
  undefined8 uVar9;
  char (*in_stack_ffffffffffffff58) [131];
  undefined1 local_88 [8];
  string _msg;
  Float32 *BorderColor;
  ImmutableSamplerDesc *SrcSmplr;
  Uint32 i_1;
  ImmutableSamplerDesc *ImmutableSamplers;
  ShaderResourceVariableDesc *SrcVar;
  Uint32 i;
  ShaderResourceVariableDesc *Variables;
  FixedLinearAllocator *MemPool_local;
  PipelineResourceLayoutDesc *DstLayout_local;
  PipelineResourceLayoutDesc *SrcLayout_local;
  
  if (SrcLayout->Variables != (ShaderResourceVariableDesc *)0x0) {
    pSVar4 = FixedLinearAllocator::ConstructArray<Diligent::ShaderResourceVariableDesc>
                       (MemPool,(ulong)SrcLayout->NumVariables);
    DstLayout->Variables = pSVar4;
    for (SrcVar._4_4_ = 0; SrcVar._4_4_ < SrcLayout->NumVariables; SrcVar._4_4_ = SrcVar._4_4_ + 1)
    {
      pSVar5 = SrcLayout->Variables + SrcVar._4_4_;
      pSVar6 = pSVar4 + SrcVar._4_4_;
      pSVar6->Name = pSVar5->Name;
      pSVar6->ShaderStages = pSVar5->ShaderStages;
      SVar2 = pSVar5->Flags;
      pSVar6->Type = pSVar5->Type;
      pSVar6->Flags = SVar2;
      pCVar7 = FixedLinearAllocator::CopyString(MemPool,pSVar5->Name,0);
      pSVar4[SrcVar._4_4_].Name = pCVar7;
    }
  }
  if (SrcLayout->ImmutableSamplers != (ImmutableSamplerDesc *)0x0) {
    pIVar8 = FixedLinearAllocator::ConstructArray<Diligent::ImmutableSamplerDesc>
                       (MemPool,(ulong)SrcLayout->NumImmutableSamplers);
    DstLayout->ImmutableSamplers = pIVar8;
    for (SrcSmplr._4_4_ = 0; SrcSmplr._4_4_ < SrcLayout->NumImmutableSamplers;
        SrcSmplr._4_4_ = SrcSmplr._4_4_ + 1) {
      __src = SrcLayout->ImmutableSamplers + SrcSmplr._4_4_;
      _msg.field_2._8_8_ = (__src->Desc).BorderColor;
      if ((((((*(float *)_msg.field_2._8_8_ != 0.0) || (NAN(*(float *)_msg.field_2._8_8_))) ||
            (fVar1 = (float)(__src->Desc).BorderColor[1], fVar1 != 0.0)) ||
           (((NAN(fVar1) || (fVar1 = (float)(__src->Desc).BorderColor[2], fVar1 != 0.0)) ||
            ((NAN(fVar1) ||
             ((fVar1 = (float)(__src->Desc).BorderColor[3], fVar1 != 0.0 || (NAN(fVar1))))))))) &&
          ((*(float *)_msg.field_2._8_8_ != 0.0 ||
           (((((NAN(*(float *)_msg.field_2._8_8_) ||
               (fVar1 = (float)(__src->Desc).BorderColor[1], fVar1 != 0.0)) || (NAN(fVar1))) ||
             ((fVar1 = (float)(__src->Desc).BorderColor[2], fVar1 != 0.0 || (NAN(fVar1))))) ||
            ((fVar1 = (float)(__src->Desc).BorderColor[3], fVar1 != 1.0 || (NAN(fVar1))))))))) &&
         ((((*(float *)_msg.field_2._8_8_ != 1.0 || (NAN(*(float *)_msg.field_2._8_8_))) ||
           (fVar1 = (float)(__src->Desc).BorderColor[1], fVar1 != 1.0)) ||
          ((((NAN(fVar1) || (fVar1 = (float)(__src->Desc).BorderColor[2], fVar1 != 1.0)) ||
            (NAN(fVar1))) ||
           ((fVar1 = (float)(__src->Desc).BorderColor[3], fVar1 != 1.0 || (NAN(fVar1))))))))) {
        FormatString<char[33],char_const*,char[27],float,char[3],float,char[3],float,char[3],float,char[131]>
                  ((string *)local_88,(Diligent *)"Immutable sampler for variable \"",
                   (char (*) [33])&__src->SamplerOrTextureName,
                   (char **)"\" specifies border color (",(char (*) [27])_msg.field_2._8_8_,
                   (float *)0x490639,(char (*) [3])((__src->Desc).BorderColor + 1),(float *)0x490639
                   ,(char (*) [3])((__src->Desc).BorderColor + 2),(float *)0x490639,
                   (char (*) [3])((__src->Desc).BorderColor + 3),
                   (float *)
                   "). D3D12 static samplers only allow transparent black (0,0,0,0), opaque black (0,0,0,1) or opaque white (1,1,1,1) as border colors"
                   ,in_stack_ffffffffffffff58);
        puVar3 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar9 = std::__cxx11::string::c_str();
          (*(code *)puVar3)(1,uVar9,0);
        }
        std::__cxx11::string::~string((string *)local_88);
      }
      memcpy(pIVar8 + SrcSmplr._4_4_,__src,0x48);
      pCVar7 = FixedLinearAllocator::CopyString(MemPool,__src->SamplerOrTextureName,0);
      pIVar8[SrcSmplr._4_4_].SamplerOrTextureName = pCVar7;
    }
  }
  return;
}

Assistant:

static void CopyResourceLayout(const PipelineResourceLayoutDesc& SrcLayout, PipelineResourceLayoutDesc& DstLayout, FixedLinearAllocator& MemPool)
    {
        if (SrcLayout.Variables != nullptr)
        {
            ShaderResourceVariableDesc* const Variables = MemPool.ConstructArray<ShaderResourceVariableDesc>(SrcLayout.NumVariables);
            DstLayout.Variables                         = Variables;
            for (Uint32 i = 0; i < SrcLayout.NumVariables; ++i)
            {
                const ShaderResourceVariableDesc& SrcVar{SrcLayout.Variables[i]};
                Variables[i]      = SrcVar;
                Variables[i].Name = MemPool.CopyString(SrcVar.Name);
            }
        }

        if (SrcLayout.ImmutableSamplers != nullptr)
        {
            ImmutableSamplerDesc* const ImmutableSamplers = MemPool.ConstructArray<ImmutableSamplerDesc>(SrcLayout.NumImmutableSamplers);
            DstLayout.ImmutableSamplers                   = ImmutableSamplers;
            for (Uint32 i = 0; i < SrcLayout.NumImmutableSamplers; ++i)
            {
                const ImmutableSamplerDesc& SrcSmplr = SrcLayout.ImmutableSamplers[i];
#ifdef DILIGENT_DEVELOPMENT
                {
                    const Float32* BorderColor = SrcSmplr.Desc.BorderColor;
                    if (!((BorderColor[0] == 0 && BorderColor[1] == 0 && BorderColor[2] == 0 && BorderColor[3] == 0) ||
                          (BorderColor[0] == 0 && BorderColor[1] == 0 && BorderColor[2] == 0 && BorderColor[3] == 1) ||
                          (BorderColor[0] == 1 && BorderColor[1] == 1 && BorderColor[2] == 1 && BorderColor[3] == 1)))
                    {
                        LOG_WARNING_MESSAGE("Immutable sampler for variable \"", SrcSmplr.SamplerOrTextureName, "\" specifies border color (",
                                            BorderColor[0], ", ", BorderColor[1], ", ", BorderColor[2], ", ", BorderColor[3],
                                            "). D3D12 static samplers only allow transparent black (0,0,0,0), opaque black (0,0,0,1) or opaque white (1,1,1,1) as border colors");
                    }
                }
#endif

                ImmutableSamplers[i]                      = SrcSmplr;
                ImmutableSamplers[i].SamplerOrTextureName = MemPool.CopyString(SrcSmplr.SamplerOrTextureName);
            }
        }
    }